

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_encrypted_extensions
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  code *pcVar1;
  size_t sVar2;
  uint16_t uVar3;
  ptls_handshake_properties_t *ppVar4;
  int iVar5;
  uint8_t *end_00;
  uint8_t *puVar6;
  uint8_t *puVar7;
  undefined4 uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ptls_iovec_t pVar11;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t local_230;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  st_ptls_extension_bitmap_t bitmap;
  int skip_early_data;
  int ret;
  ptls_raw_extension_t unknown_extensions [17];
  uint16_t local_42;
  uint8_t *puStack_40;
  uint16_t type;
  uint8_t *esni;
  uint8_t *end;
  uint8_t *src;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  esni = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x58;
  puStack_40 = (uint8_t *)0x0;
  bitmap.bits[0] = '\x01';
  bitmap.bits[1] = '\0';
  bitmap.bits[2] = '\0';
  bitmap.bits[3] = '\0';
  skip_early_data._0_2_ = 0xffff;
  src = (uint8_t *)properties;
  properties_local = (ptls_handshake_properties_t *)tls;
  init_extension_bitmap((st_ptls_extension_bitmap_t *)&_capacity,'\b');
  _block_size = 2;
  if ((ulong)((long)esni - (long)end) < 2) {
    bitmap.bits[4] = '2';
    bitmap.bits[5] = '\0';
    bitmap.bits[6] = '\0';
    bitmap.bits[7] = '\0';
  }
  else {
    end_1 = (uint8_t *)0x0;
    do {
      puVar9 = end + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
      _block_size = _block_size - 1;
      end = puVar9;
    } while (_block_size != 0);
    if (esni + -(long)puVar9 < end_1) {
      bitmap.bits[4] = '2';
      bitmap.bits[5] = '\0';
      bitmap.bits[6] = '\0';
      bitmap.bits[7] = '\0';
    }
    else {
      puVar9 = puVar9 + (long)end_1;
      do {
        while( true ) {
          if (end == puVar9) {
            if (end != puVar9) {
              return 0x32;
            }
            if (end != esni) {
              return 0x32;
            }
            if (properties_local[2].field_0.server.cookie.key == (void *)0x0) {
              if (puStack_40 != (uint8_t *)0x0) {
                return 0x2f;
              }
            }
            else {
              if ((puStack_40 == (uint8_t *)0x0) ||
                 (iVar5 = (*ptls_mem_equal)(puStack_40,
                                            (void *)((long)properties_local[2].field_0.server.cookie
                                                           .key + 0x10),0x10), iVar5 == 0)) {
                return 0x2f;
              }
              free_esni_secret((st_ptls_esni_secret_t **)((long)&properties_local[2].field_0 + 0x48)
                               ,0);
            }
            if ((properties_local[3].field_0.server.selected_psk_binder.base[0x38] >> 1 & 1) != 0) {
              if (bitmap.bits._0_4_ != 0) {
                properties_local[3].field_0.server.selected_psk_binder.base[0x38] =
                     properties_local[3].field_0.server.selected_psk_binder.base[0x38] & 0xfd;
              }
              if (src != (uint8_t *)0x0) {
                uVar8 = 2;
                if (bitmap.bits._0_4_ != 0) {
                  uVar8 = 1;
                }
                *(undefined4 *)(src + 0x28) = uVar8;
              }
            }
            bitmap.bits._4_4_ =
                 report_unknown_extensions
                           ((ptls_t *)properties_local,(ptls_handshake_properties_t *)src,
                            (ptls_raw_extension_t *)&skip_early_data);
            if (bitmap.bits._4_4_ != 0) {
              return bitmap.bits._4_4_;
            }
            ptls__key_schedule_update_hash
                      ((ptls_key_schedule_t *)
                       (properties_local->field_0).server.cookie.additional_data.base,
                       (uint8_t *)tls_local,(size_t)message_local.base);
            uVar8 = 4;
            if ((*(byte *)((long)&properties_local[2].field_0 + 0x60) >> 1 & 1) != 0) {
              uVar8 = 7;
            }
            *(undefined4 *)((long)&properties_local->field_0 + 8) = uVar8;
            return 0x202;
          }
          bitmap.bits._4_4_ = ptls_decode16(&local_42,&end,puVar9);
          if (bitmap.bits._4_4_ != 0) {
            return bitmap.bits._4_4_;
          }
          iVar5 = extension_bitmap_is_set((st_ptls_extension_bitmap_t *)&_capacity,local_42);
          if (iVar5 != 0) {
            return 0x2f;
          }
          extension_bitmap_set((st_ptls_extension_bitmap_t *)&_capacity,local_42);
          ppVar4 = properties_local;
          uVar3 = local_42;
          _block_size_1 = 2;
          if ((ulong)((long)puVar9 - (long)end) < 2) {
            return 0x32;
          }
          end_2 = (uint8_t *)0x0;
          do {
            puVar10 = end + 1;
            end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end);
            _block_size_1 = _block_size_1 - 1;
            end = puVar10;
          } while (_block_size_1 != 0);
          if (puVar9 + -(long)puVar10 < end_2) {
            return 0x32;
          }
          end_00 = puVar10 + (long)end_2;
          if ((properties_local->field_0).client.negotiated_protocols.list[0xb].len != 0) {
            pcVar1 = *(code **)(properties_local->field_0).client.negotiated_protocols.list[0xb].len
            ;
            sVar2 = (properties_local->field_0).client.negotiated_protocols.list[0xb].len;
            pVar11 = ptls_iovec_init(puVar10,(long)end_00 - (long)puVar10);
            _capacity_2 = (size_t)pVar11.base;
            local_230 = pVar11.len;
            iVar5 = (*pcVar1)(sVar2,ppVar4,8,uVar3,_capacity_2,local_230);
            bitmap.bits._4_4_ = ZEXT14(iVar5 != 0);
            if (iVar5 != 0) {
              return bitmap.bits._4_4_;
            }
          }
          if (local_42 == 0) break;
          if (local_42 == 0x10) {
            _block_size_2 = 2;
            if ((ulong)((long)end_00 - (long)end) < 2) {
              return 0x32;
            }
            end_3 = (uint8_t *)0x0;
            do {
              puVar10 = end + 1;
              end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end);
              _block_size_2 = _block_size_2 - 1;
              end = puVar10;
            } while (_block_size_2 != 0);
            if (end_00 + -(long)puVar10 < end_3) {
              return 0x32;
            }
            puVar6 = puVar10 + (long)end_3;
            _block_size_3 = 1;
            if (puVar6 == puVar10) {
              return 0x32;
            }
            end_4 = (uint8_t *)0x0;
            do {
              puVar10 = end + 1;
              end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end);
              _block_size_3 = _block_size_3 - 1;
              end = puVar10;
            } while (_block_size_3 != 0);
            if (puVar6 + -(long)puVar10 < end_4) {
              return 0x32;
            }
            puVar7 = puVar10 + (long)end_4;
            if (puVar10 == puVar7) {
              return 0x32;
            }
            iVar5 = ptls_set_negotiated_protocol
                              ((ptls_t *)properties_local,(char *)puVar10,
                               (long)puVar7 - (long)puVar10);
            if (iVar5 != 0) {
              return iVar5;
            }
            if (puVar7 != puVar6) {
              return 0x28;
            }
            if (puVar7 != puVar6) {
              return 0x32;
            }
            if (puVar7 != end_00) {
              return 0x32;
            }
            bitmap.bits[4] = '\0';
            bitmap.bits[5] = '\0';
            bitmap.bits[6] = '\0';
            bitmap.bits[7] = '\0';
            end = end_00;
          }
          else if (local_42 == 0x2a) {
            if ((properties_local[3].field_0.server.selected_psk_binder.base[0x38] >> 1 & 1) == 0) {
              return 0x2f;
            }
            bitmap.bits[0] = '\0';
            bitmap.bits[1] = '\0';
            bitmap.bits[2] = '\0';
            bitmap.bits[3] = '\0';
            end = end_00;
          }
          else if (local_42 == 0xffce) {
            if ((long)end_00 - (long)end != 0x10) {
              return 0x2f;
            }
            puStack_40 = end;
            end = end_00;
          }
          else {
            handle_unknown_extension
                      ((ptls_t *)properties_local,(ptls_handshake_properties_t *)src,local_42,end,
                       end_00,(ptls_raw_extension_t *)&skip_early_data);
            end = end_00;
          }
        }
        if (end != end_00) {
          return 0x32;
        }
      } while ((properties_local[2].field_0.client.negotiated_protocols.count != 0) &&
              (iVar5 = ptls_server_name_is_ipaddr
                                 ((char *)properties_local[2].field_0.client.negotiated_protocols.
                                          count), end = end_00, iVar5 == 0));
      bitmap.bits[4] = '/';
      bitmap.bits[5] = '\0';
      bitmap.bits[6] = '\0';
      bitmap.bits[7] = '\0';
    }
  }
  iVar5._0_1_ = bitmap.bits[4];
  iVar5._1_1_ = bitmap.bits[5];
  iVar5._2_1_ = bitmap.bits[6];
  iVar5._3_1_ = bitmap.bits[7];
  return iVar5;
}

Assistant:

static int client_handle_encrypted_extensions(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len, *esni = NULL;
    uint16_t type;
    ptls_raw_extension_t unknown_extensions[MAX_UNKNOWN_EXTENSIONS + 1];
    int ret, skip_early_data = 1;

    unknown_extensions[0].type = UINT16_MAX;

    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, &type, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, type,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (type) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (!(tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME:
            if (end - src != PTLS_ESNI_NONCE_SIZE) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            esni = src;
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                ptls_decode_open_block(src, end, 1, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    if ((ret = ptls_set_negotiated_protocol(tls, (const char *)src, end - src)) != 0)
                        goto Exit;
                    src = end;
                });
                if (src != end) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if (!tls->client.using_early_data) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            skip_early_data = 0;
            break;
        default:
            handle_unknown_extension(tls, properties, type, src, end, unknown_extensions);
            break;
        }
        src = end;
    });

    if (tls->esni != NULL) {
        if (esni == NULL || !ptls_mem_equal(esni, tls->esni->nonce, PTLS_ESNI_NONCE_SIZE)) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        free_esni_secret(&tls->esni, 0);
    } else {
        if (esni != NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    if (tls->client.using_early_data) {
        if (skip_early_data)
            tls->client.using_early_data = 0;
        if (properties != NULL)
            properties->client.early_data_acceptance = skip_early_data ? PTLS_EARLY_DATA_REJECTED : PTLS_EARLY_DATA_ACCEPTED;
    }
    if ((ret = report_unknown_extensions(tls, properties, unknown_extensions)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state =
        tls->is_psk_handshake ? PTLS_STATE_CLIENT_EXPECT_FINISHED : PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    return ret;
}